

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  FileDescriptor *file;
  int iVar1;
  size_type sVar2;
  const_reference ppFVar3;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *output;
  FileDescriptorProto *proto;
  char *pcVar4;
  int *piVar5;
  ostream *poVar6;
  bool bVar7;
  undefined1 local_f8 [8];
  FileOutputStream out;
  int fd;
  FileDescriptorProto *file_proto;
  int i_1;
  int local_84;
  undefined1 local_80 [4];
  int i;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  FileDescriptorSet::FileDescriptorSet
            ((FileDescriptorSet *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((this->imports_in_descriptor_set_ & 1U) == 0) {
    for (file_proto._0_4_ = 0;
        sVar2 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(parsed_files), (ulong)(long)(int)file_proto < sVar2;
        file_proto._0_4_ = (int)file_proto + 1) {
      proto = FileDescriptorSet::add_file
                        ((FileDescriptorSet *)
                         &already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ppFVar3 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](parsed_files,(long)(int)file_proto);
      FileDescriptor::CopyTo(*ppFVar3,proto);
      if ((this->source_info_in_descriptor_set_ & 1U) != 0) {
        ppFVar3 = std::
                  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::operator[](parsed_files,(long)(int)file_proto);
        FileDescriptor::CopySourceCodeInfoTo(*ppFVar3,proto);
      }
    }
  }
  else {
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           *)local_80);
    for (local_84 = 0;
        sVar2 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(parsed_files), (ulong)(long)local_84 < sVar2; local_84 = local_84 + 1) {
      ppFVar3 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](parsed_files,(long)local_84);
      file = *ppFVar3;
      bVar7 = this->source_info_in_descriptor_set_;
      output = FileDescriptorSet::mutable_file
                         ((FileDescriptorSet *)
                          &already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
      GetTransitiveDependencies
                (file,(bool)(bVar7 & 1),
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)local_80,output);
    }
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)local_80);
  }
  do {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    out.impl_.buffer_used_ = open(pcVar4,0x241,0x1b6);
    bVar7 = false;
    if (out.impl_.buffer_used_ < 0) {
      piVar5 = __errno_location();
      bVar7 = *piVar5 == 4;
    }
  } while (bVar7);
  if (out.impl_.buffer_used_ < 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    perror(pcVar4);
    this_local._7_1_ = false;
    out.impl_.buffer_size_ = 1;
  }
  else {
    io::FileOutputStream::FileOutputStream((FileOutputStream *)local_f8,out.impl_.buffer_used_,-1);
    bVar7 = MessageLite::SerializeToZeroCopyStream
                      ((MessageLite *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count
                       ,(ZeroCopyOutputStream *)local_f8);
    if (bVar7) {
      bVar7 = io::FileOutputStream::Close((FileOutputStream *)local_f8);
      if (bVar7) {
        this_local._7_1_ = true;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&this->descriptor_set_name_);
        poVar6 = std::operator<<(poVar6,": ");
        iVar1 = io::FileOutputStream::GetErrno((FileOutputStream *)local_f8);
        pcVar4 = strerror(iVar1);
        poVar6 = std::operator<<(poVar6,pcVar4);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&this->descriptor_set_name_);
      poVar6 = std::operator<<(poVar6,": ");
      iVar1 = io::FileOutputStream::GetErrno((FileOutputStream *)local_f8);
      pcVar4 = strerror(iVar1);
      poVar6 = std::operator<<(poVar6,pcVar4);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      io::FileOutputStream::Close((FileOutputStream *)local_f8);
      this_local._7_1_ = false;
    }
    out.impl_.buffer_size_ = 1;
    io::FileOutputStream::~FileOutputStream((FileOutputStream *)local_f8);
  }
  FileDescriptorSet::~FileDescriptorSet
            ((FileDescriptorSet *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const vector<const FileDescriptor*> parsed_files) {
  FileDescriptorSet file_set;

  if (imports_in_descriptor_set_) {
    set<const FileDescriptor*> already_seen;
    for (int i = 0; i < parsed_files.size(); i++) {
      GetTransitiveDependencies(parsed_files[i],
                                source_info_in_descriptor_set_,
                                &already_seen, file_set.mutable_file());
    }
  } else {
    for (int i = 0; i < parsed_files.size(); i++) {
      FileDescriptorProto* file_proto = file_set.add_file();
      parsed_files[i]->CopyTo(file_proto);
      if (source_info_in_descriptor_set_) {
        parsed_files[i]->CopySourceCodeInfoTo(file_proto);
      }
    }
  }

  int fd;
  do {
    fd = open(descriptor_set_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    return false;
  }

  return true;
}